

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOMPI.cpp
# Opt level: O0

void adios2::core::RegisterMPIEngines(void)

{
  EngineFactoryEntry EVar1;
  undefined1 *puVar2;
  EngineFactoryEntry *this;
  _func_shared_ptr<adios2::core::Engine>_IO_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Mode_Comm
  *in_stack_ffffffffffffff68;
  function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm)>
  *in_stack_ffffffffffffff70;
  undefined1 auVar3 [24];
  undefined1 in_stack_ffffffffffffff78 [64];
  undefined1 local_21 [33];
  
  this = (EngineFactoryEntry *)local_21;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_21 + 1),"ssc",(allocator *)this);
  puVar2 = &stack0xffffffffffffff68;
  std::
  function<std::shared_ptr<adios2::core::Engine>(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)>
  ::
  function<std::shared_ptr<adios2::core::Engine>(&)(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm),void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  function<std::shared_ptr<adios2::core::Engine>(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)>
  ::
  function<std::shared_ptr<adios2::core::Engine>(&)(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm),void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
  ::function((function<std::shared_ptr<adios2::core::Engine>_(adios2::core::IO_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_adios2::Mode,_adios2::helper::Comm,_const_char_*,_unsigned_long)>
              *)this);
  EVar1.MakeReader.super__Function_base._M_functor._8_8_ = this;
  EVar1.MakeReader.super__Function_base._M_functor._M_unused._M_object = puVar2;
  EVar1.MakeReader.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff68;
  EVar1.MakeReader._M_invoker = (_Invoker_type)in_stack_ffffffffffffff70;
  auVar3 = SUB3224(in_stack_ffffffffffffff78._0_32_,0);
  EVar1.MakeWriter.super__Function_base._M_functor = (_Any_data)auVar3._0_16_;
  EVar1.MakeWriter.super__Function_base._M_manager = (_Manager_type)auVar3._16_8_;
  EVar1.MakeWriter._M_invoker = (_Invoker_type)SUB328(in_stack_ffffffffffffff78._0_32_,0x18);
  auVar3 = SUB3224(in_stack_ffffffffffffff78._32_32_,0);
  EVar1.MakeReaderWithMD.super__Function_base._M_functor = (_Any_data)auVar3._0_16_;
  EVar1.MakeReaderWithMD.super__Function_base._M_manager = (_Manager_type)auVar3._16_8_;
  EVar1.MakeReaderWithMD._M_invoker = (_Invoker_type)SUB328(in_stack_ffffffffffffff78._32_32_,0x18);
  adios2::core::IO::RegisterEngine((string *)(local_21 + 1),EVar1);
  IO::EngineFactoryEntry::~EngineFactoryEntry(this);
  std::__cxx11::string::~string((string *)(local_21 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_21);
  return;
}

Assistant:

void RegisterMPIEngines()
{
    IO::RegisterEngine("ssc", IO::EngineFactoryEntry{MakeEngineMPI<engine::SscReader>,
                                                     MakeEngineMPI<engine::SscWriter>});
#ifdef ADIOS2_HAVE_DATASPACES
    IO::RegisterEngine("dataspaces",
                       IO::EngineFactoryEntry{MakeEngineMPI<engine::DataSpacesReader>,
                                              MakeEngineMPI<engine::DataSpacesWriter>});
#endif
#if defined(ADIOS2_HAVE_HDF5_PARALLEL)
    interop::RegisterHDF5Common_MPI_API();
#endif
}